

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

int float32_lt_quiet_mips(float32 a,float32 b,float_status *status)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  
  if (status->flush_inputs_to_zero != '\0') {
    if ((a & 0x7fffff) != 0 && (a & 0x7f800000) == 0) {
      status->float_exception_flags = status->float_exception_flags | 0x40;
      a = a & 0x80000000;
    }
    if ((b & 0x7fffff) != 0 && (b & 0x7f800000) == 0) {
      status->float_exception_flags = status->float_exception_flags | 0x40;
      b = b & 0x80000000;
    }
  }
  if (((~a & 0x7f800000) != 0 || (a & 0x7fffff) == 0) &&
     ((b & 0x7fffff) == 0 || (~b & 0x7f800000) != 0)) {
    if ((int)(b ^ a) < 0) {
      bVar2 = ((b | a) & 0x7fffffff) != 0;
      bVar3 = (int)a < 0;
    }
    else {
      bVar2 = a != b;
      bVar3 = (int)a < 0 != a < b;
    }
    bVar1 = bVar3 & bVar2;
    goto LAB_0071eb63;
  }
  if (status->snan_bit_is_one == '\0') {
    if (((a & 0x3fffff) != 0 && (a & 0x7fc00000) == 0x7f800000) ||
       ((b & 0x3fffff) != 0 && (b & 0x7fc00000) == 0x7f800000)) goto LAB_0071eb49;
  }
  else if (0xff7fffff < b * 2 || 0xff7fffff < a * 2) {
LAB_0071eb49:
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  bVar1 = 0;
LAB_0071eb63:
  return (int)bVar1;
}

Assistant:

float32 float32_squash_input_denormal(float32 a, float_status *status)
{
    if (status->flush_inputs_to_zero) {
        FloatParts p = float32_unpack_raw(a);
        if (parts_squash_denormal(p, status)) {
            return float32_set_sign(float32_zero, p.sign);
        }
    }
    return a;
}